

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_decompress.c
# Opt level: O0

int decode_existing_symbol(byte_t *input_buffer)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  long local_180;
  uint local_174;
  int local_170;
  int i;
  int bit_idx;
  int byte_idx;
  int num_bytes;
  int max_bits;
  long missing;
  byte_t sub_buffer [32];
  undefined1 local_12a [8];
  bit_array_t bit_array;
  adh_node_t *node;
  long original_input_buffer_bit_idx;
  byte_t *input_buffer_local;
  
  lVar2 = in_bit_idx;
  bit_array.buffer[0xf8] = '\0';
  bit_array.buffer[0xf9] = '\0';
  bit_array.buffer[0xfa] = '\0';
  bit_array.buffer[0xfb] = '\0';
  bit_array.buffer[0xfc] = '\0';
  bit_array.buffer[0xfd] = '\0';
  bit_array.buffer[0xfe] = '\0';
  bit_array.buffer[0xff] = '\0';
  memset(local_12a,0,0x102);
  memset(&missing,0,0x20);
  local_180 = (last_bit_idx - in_bit_idx) + 1;
  if (0x100 < local_180) {
    local_180 = 0x100;
  }
  iVar4 = read_data_cross_bytes(input_buffer,(int)local_180,(byte_t *)&missing);
  i = 0;
  do {
    lVar3 = in_bit_idx;
    lVar1 = last_bit_idx;
    if (iVar4 <= i || bit_array.buffer._248_8_ != 0) {
      bVar6 = bit_array.buffer._248_8_ != 0;
      if (bVar6) {
        in_bit_idx = lVar2 + (ulong)(ushort)local_12a._0_2_;
        output_symbol((byte_t)*(undefined2 *)bit_array.buffer._248_8_);
        adh_update_tree((adh_node_t *)bit_array.buffer._248_8_,false);
      }
      else {
        pcVar5 = fmt_bit_array((bit_array_t *)local_12a);
        log_error("decode_existing_symbol",
                  "cannot find node: in_bit_idx=%u last_bit_idx=%u bin=%s\n",lVar3,lVar1,pcVar5);
      }
      input_buffer_local._4_4_ = (uint)!bVar6;
      return input_buffer_local._4_4_;
    }
    for (local_170 = 0; local_170 < 8 && bit_array.buffer._248_8_ == 0; local_170 = local_170 + 1) {
      if (0x100 < (ushort)local_12a._0_2_) {
        log_error("decode_existing_symbol","bit_array_size (%d) >= MAX_CODE_BITS (%d)",
                  (ulong)(ushort)local_12a._0_2_,0x100);
        return 1;
      }
      for (local_174 = (uint)(ushort)local_12a._0_2_; 0 < (int)local_174; local_174 = local_174 - 1)
      {
        local_12a[(long)(int)local_174 + 2] = local_12a[(long)(int)(local_174 - 1) + 2];
      }
      local_12a[2] = bit_check(sub_buffer[(long)i + -8],7 - local_170);
      local_12a._0_2_ = local_12a._0_2_ + 1;
      bit_array.buffer._248_8_ = adh_search_leaf_by_encoding((bit_array_t *)local_12a);
    }
    i = i + 1;
  } while( true );
}

Assistant:

int decode_existing_symbol(const byte_t input_buffer[]) {
    long original_input_buffer_bit_idx = in_bit_idx;

    adh_node_t* node = NULL;
    bit_array_t bit_array = {0};
    byte_t  sub_buffer[MAX_CODE_BYTES] = {0};
    long missing = last_bit_idx - in_bit_idx + 1;

#ifdef _DEBUG
    log_debug("decode_existing_symbol", "in_bit_idx=%-8u last_bit_idx=%u missing=%d\n",
              in_bit_idx, last_bit_idx, missing);
#endif

    int max_bits = MAX_CODE_BITS < missing ? MAX_CODE_BITS : missing;
    int num_bytes = read_data_cross_bytes(input_buffer, max_bits, sub_buffer);

    for (int byte_idx = 0; byte_idx < num_bytes && node == NULL; ++byte_idx) {
        for (int bit_idx = 0; bit_idx < SYMBOL_BITS && node == NULL; ++bit_idx) {
            if(bit_array.length > MAX_CODE_BITS) {
                log_error("decode_existing_symbol", "bit_array_size (%d) >= MAX_CODE_BITS (%d)", bit_array.length, MAX_CODE_BITS);
                return RC_FAIL;
            }

            // shift left previous bits
            for (int i = bit_array.length; i > 0; --i) {
                bit_array.buffer[i] = bit_array.buffer[i-1];
            }

            bit_array.buffer[0] = bit_check(sub_buffer[byte_idx], SYMBOL_BITS - bit_idx -1);
            bit_array.length++;
            node = adh_search_leaf_by_encoding(&bit_array);
        }
    }

    if(node == NULL) {
        log_error("decode_existing_symbol", "cannot find node: in_bit_idx=%u last_bit_idx=%u bin=%s\n",
                in_bit_idx, last_bit_idx, fmt_bit_array(&bit_array) );
        return RC_FAIL;
    }

#ifdef _DEBUG
    log_debug("decode_existing_symbol", "%s bin=%s\n", fmt_symbol(node->symbol), fmt_bit_array(&bit_array));
#endif

    in_bit_idx = original_input_buffer_bit_idx + bit_array.length;
    output_symbol((byte_t)node->symbol);
    adh_update_tree(node, false);
    return RC_OK;
}